

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optim_mir.cpp
# Opt level: O0

void push(VarId *a)

{
  value_type *in_stack_00000008;
  vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *in_stack_00000010;
  
  std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::push_back
            (in_stack_00000010,in_stack_00000008);
  return;
}

Assistant:

void push(mir::inst::VarId a) { V.push_back(a); }